

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

void Au_ManReorderModels_rec(Au_Ntk_t *pNtk,Vec_Int_t *vOrder)

{
  int iVar1;
  Au_Obj_t *p;
  Au_Ntk_t *pNtk_00;
  int local_2c;
  int k;
  Au_Obj_t *pObj;
  Au_Ntk_t *pBoxModel;
  Vec_Int_t *vOrder_local;
  Au_Ntk_t *pNtk_local;
  
  if (pNtk->fMark == 0) {
    pNtk->fMark = 1;
    for (local_2c = 0; iVar1 = Vec_IntSize(&pNtk->vObjs), local_2c < iVar1; local_2c = local_2c + 1)
    {
      p = Au_NtkObjI(pNtk,local_2c);
      iVar1 = Au_ObjIsBox(p);
      if (((iVar1 != 0) && (pNtk_00 = Au_ObjModel(p), pNtk_00 != (Au_Ntk_t *)0x0)) &&
         (pNtk_00 != pNtk)) {
        Au_ManReorderModels_rec(pNtk_00,vOrder);
      }
    }
    Vec_IntPush(vOrder,pNtk->Id);
  }
  return;
}

Assistant:

void Au_ManReorderModels_rec( Au_Ntk_t * pNtk, Vec_Int_t * vOrder )
{
    Au_Ntk_t * pBoxModel;
    Au_Obj_t * pObj;
    int k;
    if ( pNtk->fMark )
        return;
    pNtk->fMark = 1;
    Au_NtkForEachBox( pNtk, pObj, k )
    {
        pBoxModel = Au_ObjModel(pObj);
        if ( pBoxModel == NULL || pBoxModel == pNtk )
            continue;
        Au_ManReorderModels_rec( pBoxModel, vOrder );
    }
    Vec_IntPush( vOrder, pNtk->Id );
}